

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapSnow16(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  
  iVar3 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar3 == 0) {
    if (0 < h) {
      uVar1 = l->startSeed;
      lVar7 = (long)w;
      piVar9 = out + lVar7 + 3;
      lVar6 = 0;
      do {
        if (0 < w) {
          lVar8 = (long)(z + (int)lVar6);
          lVar10 = 0;
          do {
            if (piVar9[lVar10] == 0) {
              iVar3 = 0;
            }
            else {
              lVar4 = (long)(x + (int)lVar10);
              lVar5 = uVar1 + lVar4;
              lVar5 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar8;
              lVar4 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar4;
              lVar5 = (lVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar4 + lVar8;
              auVar2._8_8_ = lVar5 >> 0x3f;
              auVar2._0_8_ = lVar5 >> 0x18;
              iVar3 = 1;
              if (SUB168(auVar2 % SEXT816(5),0) == 0) {
                iVar3 = 0xc;
              }
            }
            out[lVar10] = iVar3;
            lVar10 = lVar10 + 1;
          } while (lVar7 != lVar10);
        }
        lVar6 = lVar6 + 1;
        out = out + lVar7;
        piVar9 = piVar9 + lVar7 + 2;
      } while (lVar6 != h);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapSnow16(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            if (v11 != ocean)
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v11 = mcFirstIsZero(cs, 5) ? snowy_tundra : plains;
            }
            out[i + j*w] = v11;
        }
    }

    return 0;
}